

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

void pbrt::ParseString(SceneRepresentation *scene,string *str)

{
  bool bVar1;
  string *in_RSI;
  unique_ptr<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_> *in_RDI;
  unique_ptr<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_> t;
  anon_class_1_0_00000001 tokError;
  unique_ptr<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_> *in_stack_00001fd8;
  SceneRepresentation *in_stack_00001fe0;
  function<void_(const_char_*,_const_pbrt::FileLoc_*)> *in_stack_ffffffffffffff70;
  string *str_00;
  undefined1 local_78 [56];
  string local_40;
  unique_ptr<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_> *local_8;
  
  str_00 = &local_40;
  local_8 = in_RDI;
  std::__cxx11::string::string((string *)str_00,in_RSI);
  std::function<void(char_const*,pbrt::FileLoc_const*)>::
  function<pbrt::ParseString(pbrt::SceneRepresentation*,std::__cxx11::string)::__0&,void>
            ((function<void_(const_char_*,_const_pbrt::FileLoc_*)> *)(local_78 + 0x18),
             (anon_class_1_0_00000001 *)str_00);
  Tokenizer::CreateFromString(str_00,in_stack_ffffffffffffff70);
  std::function<void_(const_char_*,_const_pbrt::FileLoc_*)>::~function
            ((function<void_(const_char_*,_const_pbrt::FileLoc_*)> *)0x44d2ed);
  std::__cxx11::string::~string((string *)&local_40);
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_> *)0x44d301)
  ;
  if (bVar1) {
    in_stack_ffffffffffffff70 = (function<void_(const_char_*,_const_pbrt::FileLoc_*)> *)local_78;
    std::unique_ptr<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_>::unique_ptr
              ((unique_ptr<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_> *)
               in_stack_ffffffffffffff70,local_8);
    parse(in_stack_00001fe0,in_stack_00001fd8);
    std::unique_ptr<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_>::~unique_ptr
              ((unique_ptr<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_> *)
               in_stack_ffffffffffffff70);
  }
  local_78._9_3_ = 0;
  local_78[8] = !bVar1;
  std::unique_ptr<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_>::~unique_ptr
            ((unique_ptr<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_> *)
             in_stack_ffffffffffffff70);
  return;
}

Assistant:

void ParseString(SceneRepresentation *scene, std::string str) {
    auto tokError = [](const char *msg, const FileLoc *loc) {
        ErrorExit(loc, "%s", msg);
    };
    std::unique_ptr<Tokenizer> t = Tokenizer::CreateFromString(std::move(str), tokError);
    if (!t)
        return;
    parse(scene, std::move(t));
}